

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O1

visplane_t * R_CheckPlane(visplane_t *pl,int start,int stop)

{
  short sVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  visplane_t *pvVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  short *psVar12;
  
  if ((start < 0) || (viewwidth <= start)) {
    __assert_fail("start >= 0 && start < viewwidth",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_plane.cpp"
                  ,0x2d8,"visplane_t *R_CheckPlane(visplane_t *, int, int)");
  }
  if ((stop <= start) || (viewwidth < stop)) {
    __assert_fail("stop > start && stop <= viewwidth",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_plane.cpp"
                  ,0x2d9,"visplane_t *R_CheckPlane(visplane_t *, int, int)");
  }
  uVar11 = pl->left;
  iVar7 = pl->right;
  uVar9 = start;
  if (start < (int)uVar11) {
    uVar9 = uVar11;
  }
  if (start <= (int)uVar11) {
    uVar11 = start;
  }
  iVar2 = stop;
  if (iVar7 < stop) {
    iVar2 = iVar7;
  }
  if (iVar7 <= stop) {
    iVar7 = stop;
  }
  if ((int)uVar9 < iVar2) {
    if (*(short *)(&pl->field_0xda + (ulong)uVar9 * 2) == 0x7fff) {
      psVar12 = (short *)(&pl->field_0xdc + (ulong)uVar9 * 2);
      do {
        uVar9 = uVar9 + 1;
        if (iVar2 <= (int)uVar9) goto LAB_00309be0;
        sVar1 = *psVar12;
        psVar12 = psVar12 + 1;
      } while (sVar1 == 0x7fff);
    }
    if ((int)uVar9 < iVar2) {
      if (((pl->portal == (FSectorPortal *)0x0) || ((pl->portal->mFlags & 2) != 0)) ||
         (uVar11 = 0x80, !viewactive)) {
        uVar11 = SUB84((pl->height).D + 103079215104.0,0) * 7 +
                 (pl->picnum).texnum * 3 + pl->lightlevel & 0x7f;
      }
      pvVar6 = new_visplane(uVar11);
      (pvVar6->height).normal.Z = (pl->height).normal.Z;
      (pvVar6->height).normal.Y = (pl->height).normal.Y;
      (pvVar6->height).normal.X = (pl->height).normal.X;
      dVar3 = (pl->height).negiC;
      (pvVar6->height).D = (pl->height).D;
      (pvVar6->height).negiC = dVar3;
      (pvVar6->picnum).texnum = (pl->picnum).texnum;
      pvVar6->lightlevel = pl->lightlevel;
      (pvVar6->xform).yScale = (pl->xform).yScale;
      dVar3 = (pl->xform).xOffs;
      dVar4 = (pl->xform).yOffs;
      dVar5 = (pl->xform).xScale;
      (pvVar6->xform).baseyOffs = (pl->xform).baseyOffs;
      (pvVar6->xform).xScale = dVar5;
      (pvVar6->xform).xOffs = dVar3;
      (pvVar6->xform).yOffs = dVar4;
      (pvVar6->xform).Angle.Degrees = (pl->xform).Angle.Degrees;
      (pvVar6->xform).baseAngle.Degrees = (pl->xform).baseAngle.Degrees;
      pvVar6->colormap = pl->colormap;
      pvVar6->portal = pl->portal;
      pvVar6->extralight = pl->extralight;
      pvVar6->visibility = pl->visibility;
      (pvVar6->viewpos).Z = (pl->viewpos).Z;
      (pvVar6->viewpos).Y = (pl->viewpos).Y;
      (pvVar6->viewpos).X = (pl->viewpos).X;
      (pvVar6->viewangle).Degrees = (pl->viewangle).Degrees;
      pvVar6->sky = pl->sky;
      pvVar6->Alpha = pl->Alpha;
      pvVar6->Additive = pl->Additive;
      pvVar6->CurrentPortalUniq = pl->CurrentPortalUniq;
      pvVar6->MirrorFlags = pl->MirrorFlags;
      pvVar6->CurrentSkybox = pl->CurrentSkybox;
      pvVar6->left = start;
      pvVar6->right = stop;
      uVar8 = (ulong)(uint)viewwidth;
      if (uVar8 == 0) {
        return pvVar6;
      }
      uVar10 = 0;
      do {
        *(undefined2 *)(&pvVar6->field_0xda + uVar10 * 2) = 0x7fff;
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
      return pvVar6;
    }
  }
LAB_00309be0:
  pl->left = uVar11;
  pl->right = iVar7;
  return pl;
}

Assistant:

visplane_t *R_CheckPlane (visplane_t *pl, int start, int stop)
{
	int intrl, intrh;
	int unionl, unionh;
	int x;

	assert (start >= 0 && start < viewwidth);
	assert (stop > start && stop <= viewwidth);

	if (start < pl->left)
	{
		intrl = pl->left;
		unionl = start;
	}
	else
	{
		unionl = pl->left;
		intrl = start;
	}
		
	if (stop > pl->right)
	{
		intrh = pl->right;
		unionh = stop;
	}
	else
	{
		unionh = pl->right;
		intrh = stop;
	}

	for (x = intrl; x < intrh && pl->top[x] == 0x7fff; x++)
		;

	if (x >= intrh)
	{
		// use the same visplane
		pl->left = unionl;
		pl->right = unionh;
	}
	else
	{
		// make a new visplane
		unsigned hash;

		if (pl->portal != NULL && !(pl->portal->mFlags & PORTSF_INSKYBOX) && viewactive)
		{
			hash = MAXVISPLANES;
		}
		else
		{
			hash = visplane_hash (pl->picnum.GetIndex(), pl->lightlevel, pl->height);
		}
		visplane_t *new_pl = new_visplane (hash);

		new_pl->height = pl->height;
		new_pl->picnum = pl->picnum;
		new_pl->lightlevel = pl->lightlevel;
		new_pl->xform = pl->xform;
		new_pl->colormap = pl->colormap;
		new_pl->portal = pl->portal;
		new_pl->extralight = pl->extralight;
		new_pl->visibility = pl->visibility;
		new_pl->viewpos = pl->viewpos;
		new_pl->viewangle = pl->viewangle;
		new_pl->sky = pl->sky;
		new_pl->Alpha = pl->Alpha;
		new_pl->Additive = pl->Additive;
		new_pl->CurrentPortalUniq = pl->CurrentPortalUniq;
		new_pl->MirrorFlags = pl->MirrorFlags;
		new_pl->CurrentSkybox = pl->CurrentSkybox;
		pl = new_pl;
		pl->left = start;
		pl->right = stop;
		clearbufshort (pl->top, viewwidth, 0x7fff);
	}
	return pl;
}